

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsBody.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsBody::ArchiveOUT(ChShaftsBody *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChShaftsBody>(marchive);
  ChPhysicsItem::ArchiveOUT(&this->super_ChPhysicsItem,marchive);
  local_28._value = &this->shaft_dir;
  local_28._name = "shaft_dir";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChShaftsBody::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaftsBody>();

    // serialize parent class
    ChPhysicsItem::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(shaft_dir);
    // marchive << CHNVP(shaft);  //***TODO*** serialize, with shared ptr
    // marchive << CHNVP(body); //***TODO*** serialize, with shared ptr
}